

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptrcircularlist.h
# Opt level: O1

int __thiscall
cookmem::
CircularList<cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
::remove(CircularList<cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
         *this,char *__filename)

{
  SmallMemChunk *pSVar1;
  SmallMemChunk *pSVar2;
  undefined4 *puVar3;
  SmallMemChunk *pSVar4;
  
  pSVar1 = this->m_head;
  if (pSVar1 == (SmallMemChunk *)0x0) {
    return 0;
  }
  pSVar4 = pSVar1->next;
  pSVar2 = pSVar1->prev;
  if (pSVar1 == pSVar2) {
    if (pSVar1 != pSVar4) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(0x10);
      *puVar3 = 1;
      *(char **)(puVar3 + 2) = "assertion failure.";
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
    pSVar4 = (SmallMemChunk *)0x0;
  }
  else {
    pSVar2->next = pSVar4;
    pSVar4->prev = pSVar2;
  }
  this->m_head = pSVar4;
  return (int)pSVar1;
}

Assistant:

Node*
    remove ()
    {
        if (m_head == nullptr)
        {
            return nullptr;
        }

        Node* prev = m_head->prev;
        Node* next = m_head->next;
        Node* head = m_head;

        if (m_head == prev)
        {
            COOKMEM_ASSERT(m_head == next);
            m_head = nullptr;
        }
        else
        {
            prev->next = next;
            next->prev = prev;
            m_head = next;
        }

        return head;
    }